

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusArcIntersect.cpp
# Opt level: O0

int GeoCalcs::LocusArcIntersect
              (Locus *locus,LLPoint *arcCenter,double arcRadius,LLPoint *intersection1,
              LLPoint *intersection2,double dTol,double dEps)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  LLPoint LVar4;
  double *local_148;
  LLPoint local_140;
  double local_130;
  double local_128;
  int local_11c;
  double dStack_118;
  int k;
  double newDistbase;
  double dStack_108;
  int maxCount;
  double distarray [2];
  double errarray [2];
  LLPoint locPt;
  double distbase;
  LLPoint perpPt;
  double dDistFromPt;
  double dCrsFromPt;
  LLPoint intPt;
  int i;
  double gcrs;
  undefined1 auStack_88 [4];
  int nIntersects;
  LLPoint intPt2;
  LLPoint intPt1;
  InverseResult result;
  int nIntersections;
  double dEps_local;
  double dTol_local;
  LLPoint *intersection2_local;
  LLPoint *intersection1_local;
  double arcRadius_local;
  LLPoint *arcCenter_local;
  Locus *locus_local;
  
  result.distance._4_4_ = 0;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&intPt1.longitude);
  DistVincenty(&locus->locusStart,&locus->locusEnd,(InverseResult *)&intPt1.longitude);
  LLPOINT::LLPOINT((LLPOINT *)&intPt2.longitude);
  LLPOINT::LLPOINT((LLPOINT *)auStack_88);
  iVar2 = GeodesicArcIntercept
                    (&locus->locusStart,intPt1.longitude,arcCenter,arcRadius,
                     (LLPoint *)&intPt2.longitude,(LLPoint *)auStack_88,dTol);
  iVar2 = AdjustIntersects(iVar2,locus,(LLPoint *)&intPt2.longitude,(LLPoint *)auStack_88);
  if (iVar2 == 0) {
    locus_local._4_4_ = 0;
  }
  else {
    DistVincenty(&locus->geoStart,&locus->geoEnd,(InverseResult *)&intPt1.longitude);
    for (intPt.longitude._4_4_ = 0; intPt.longitude._4_4_ < iVar2;
        intPt.longitude._4_4_ = intPt.longitude._4_4_ + 1) {
      if (intPt.longitude._4_4_ == 0) {
        local_148 = &intPt2.longitude;
      }
      else {
        local_148 = (double *)auStack_88;
      }
      dCrsFromPt = *local_148;
      intPt.latitude = local_148[1];
      LVar4 = PerpIntercept(&locus->geoStart,intPt1.longitude,(LLPoint *)&dCrsFromPt,&dDistFromPt,
                            &perpPt.longitude,dTol);
      distbase = LVar4.latitude;
      perpPt.latitude = LVar4.longitude;
      DistVincenty((LLPoint *)&distbase,&locus->geoStart,(InverseResult *)&intPt1.longitude);
      LVar4 = PointOnLocusP(locus,(LLPoint *)&distbase,dTol,dEps);
      errarray[1] = LVar4.latitude;
      locPt.latitude = LVar4.longitude;
      DistVincenty((LLPoint *)(errarray + 1),arcCenter,(InverseResult *)&intPt1.longitude);
      errarray[0] = result.reverseAzimuth - arcRadius;
      if (dTol <= ABS(errarray[0])) {
        distarray[0] = result.reverseAzimuth;
        newDistbase._4_4_ = 0xf;
        dStack_118 = result.reverseAzimuth * 1.001;
        local_11c = 0;
        while( true ) {
          bVar1 = false;
          if (local_11c < 0xf) {
            uVar3 = std::isnan(dStack_118);
            bVar1 = false;
            if ((uVar3 & 1) == 0) {
              bVar1 = dTol < ABS(errarray[0]);
            }
          }
          if (!bVar1) break;
          LVar4 = DestVincenty(&locus->geoStart,intPt1.longitude,dStack_118);
          local_140.latitude = LVar4.latitude;
          local_140.longitude = LVar4.longitude;
          LVar4 = PointOnLocusP(locus,&local_140,dTol,dEps);
          local_130 = LVar4.latitude;
          locPt.latitude = LVar4.longitude;
          local_128 = locPt.latitude;
          errarray[1] = local_130;
          DistVincenty((LLPoint *)(errarray + 1),arcCenter,(InverseResult *)&intPt1.longitude);
          dStack_108 = distarray[0];
          distarray[0] = dStack_118;
          distarray[1] = errarray[0];
          errarray[0] = result.reverseAzimuth - arcRadius;
          FindLinearRoot(&stack0xfffffffffffffef8,distarray + 1,&stack0xfffffffffffffee8);
          local_11c = local_11c + 1;
        }
      }
      bVar1 = PtIsOnLocus(locus,(LLPoint *)(errarray + 1),1e-06);
      if (bVar1) {
        if (intPt.longitude._4_4_ == 0) {
          intPt2.longitude = errarray[1];
          intPt1.latitude = locPt.latitude;
        }
        else if (intPt.longitude._4_4_ == 1) {
          _auStack_88 = errarray[1];
          intPt2.latitude = locPt.latitude;
        }
        result.distance._4_4_ = result.distance._4_4_ + 1;
      }
    }
    intersection1->latitude = intPt2.longitude;
    intersection1->longitude = intPt1.latitude;
    intersection2->latitude = _auStack_88;
    intersection2->longitude = intPt2.latitude;
    DistVincenty(intersection1,intersection2,(InverseResult *)&intPt1.longitude);
    if ((iVar2 == 2) && (bVar1 = IsNearZero(result.reverseAzimuth,5e-09), bVar1)) {
      result.distance._4_4_ = 1;
    }
    locus_local._4_4_ = result.distance._4_4_;
  }
  return locus_local._4_4_;
}

Assistant:

int LocusArcIntersect(const Locus &locus, const LLPoint &arcCenter, double arcRadius,
                          LLPoint &intersection1, LLPoint &intersection2, double dTol,
                          double dEps)
    {
        int nIntersections = 0;

        InverseResult result;
        DistVincenty(locus.locusStart, locus.locusEnd, result);

        LLPoint intPt1, intPt2;

        const int nIntersects = AdjustIntersects(GeodesicArcIntercept(locus.locusStart, result.azimuth,
                                                                      arcCenter, arcRadius, intPt1, intPt2,
                                                                      dTol),
                                                 locus, intPt1, intPt2);

        if (nIntersects == 0)
            return 0;

        DistVincenty(locus.geoStart, locus.geoEnd, result);
        const double gcrs = result.azimuth;

        for (int i = 0; i < nIntersects; i++)
        {
            LLPoint intPt = i == 0 ? intPt1 : intPt2;
            double dCrsFromPt, dDistFromPt;
            LLPoint perpPt = PerpIntercept(locus.geoStart, gcrs, intPt, dCrsFromPt, dDistFromPt, dTol);

            DistVincenty(perpPt, locus.geoStart, result);
            const double distbase = result.distance;

            LLPoint locPt = PointOnLocusP(locus, perpPt, dTol, dEps);

            DistVincenty(locPt, arcCenter, result);

            double errarray[2], distarray[2];
            errarray[1] = result.distance - arcRadius;

            if (fabs(errarray[1]) >= dTol)
            {
                distarray[1] = distbase;
                const int maxCount = 15;
                double newDistbase = 1.001 * distbase;
                int k = 0;
                while (k < maxCount && !std::isnan(newDistbase) && fabs(errarray[1]) > dTol)
                {
                    locPt = PointOnLocusP(locus, DestVincenty(locus.geoStart, gcrs, newDistbase),
                                          dTol, dEps);
                    DistVincenty(locPt, arcCenter, result);

                    distarray[0] = distarray[1];
                    distarray[1] = newDistbase;
                    errarray[0] = errarray[1];
                    errarray[1] = result.distance - arcRadius;

                    FindLinearRoot(distarray, errarray, newDistbase);
                    k++;
                }
            }

            if (PtIsOnLocus(locus, locPt, 1e-6)) //dTol))
            {
                if (i == 0)
                    intPt1 = locPt;
                else if (i == 1)
                    intPt2 = locPt;
                nIntersections++;
            }
        }
        intersection1 = intPt1;
        intersection2 = intPt2;
        DistVincenty(intersection1, intersection2, result);
        if (nIntersects == 2 && IsNearZero(result.distance, 0.5e-8))
        {
            nIntersections = 1;
        }

        return nIntersections;
    }